

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

void __thiscall
t_perl_generator::generate_serialize_container
          (t_perl_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  t_perl_generator *this_00;
  string kiter;
  string viter;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "$xfer += $output->writeSetBegin(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"$xfer += $output->writeSetBegin(",0x20);
      type_to_enum_abi_cxx11_
                (&local_170,(t_perl_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"scalar(@{$",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}));",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002f419a;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "$xfer += $output->writeListBegin(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"$xfer += $output->writeListBegin(",0x21);
      type_to_enum_abi_cxx11_
                (&local_170,(t_perl_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"scalar(@{$",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}));",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002f419a;
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "$xfer += $output->writeMapBegin(";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"$xfer += $output->writeMapBegin(",0x20);
    type_to_enum_abi_cxx11_
              (&local_170,(t_perl_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_170._M_dataplus._M_p,local_170._M_string_length);
    this_00 = (t_perl_generator *)0x3a9b9f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    type_to_enum_abi_cxx11_(&local_150,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"scalar(keys %{$",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}));",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
LAB_002f419a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"iter","");
      t_generator::tmp(&local_170,(t_generator *)this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      poVar2 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"foreach my $",0xc);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (@{$",5);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"})",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      goto LAB_002f4662;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"iter","");
      t_generator::tmp(&local_170,(t_generator *)this,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      poVar2 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"foreach my $",0xc);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (@{$",5);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}) ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      t_oop_generator::scope_up(&this->super_t_oop_generator,out);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      goto LAB_002f4662;
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"kiter","");
    t_generator::tmp(&local_170,(t_generator *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"viter","");
    t_generator::tmp(&local_150,(t_generator *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"while( my ($",0xc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",$",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") = each %{$",0xc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}) ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
LAB_002f4662:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "$xfer += $output->writeSetEnd();";
      goto LAB_002f46c9;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 == '\0') goto LAB_002f46ec;
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "$xfer += $output->writeListEnd();";
    lVar3 = 0x21;
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "$xfer += $output->writeMapEnd();";
LAB_002f46c9:
    lVar3 = 0x20;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002f46ec:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  return;
}

Assistant:

void t_perl_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    indent(out) << "$xfer += $output->writeMapBegin("
                << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "scalar(keys %{$" << prefix << "}));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $output->writeSetBegin("
                << type_to_enum(((t_set*)ttype)->get_elem_type()) << ", "
                << "scalar(@{$" << prefix << "}));" << endl;

  } else if (ttype->is_list()) {

    indent(out) << "$xfer += $output->writeListBegin("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", "
                << "scalar(@{$" << prefix << "}));" << endl;
  }

  scope_up(out);

  if (ttype->is_map()) {
    string kiter = tmp("kiter");
    string viter = tmp("viter");
    indent(out) << "while( my ($" << kiter << ",$" << viter << ") = each %{$" << prefix << "}) "
                << endl;

    scope_up(out);
    generate_serialize_map_element(out, (t_map*)ttype, kiter, viter);
    scope_down(out);

  } else if (ttype->is_set()) {
    string iter = tmp("iter");
    indent(out) << "foreach my $" << iter << " (@{$" << prefix << "})" << endl;
    scope_up(out);
    generate_serialize_set_element(out, (t_set*)ttype, iter);
    scope_down(out);

  } else if (ttype->is_list()) {
    string iter = tmp("iter");
    indent(out) << "foreach my $" << iter << " (@{$" << prefix << "}) " << endl;
    scope_up(out);
    generate_serialize_list_element(out, (t_list*)ttype, iter);
    scope_down(out);
  }

  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "$xfer += $output->writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "$xfer += $output->writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "$xfer += $output->writeListEnd();" << endl;
  }

  scope_down(out);
}